

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node_iterator * __thiscall pugi::xml_node_iterator::operator--(xml_node_iterator *this)

{
  xml_node_struct *pxVar1;
  
  pxVar1 = (this->_wrap)._root;
  if (pxVar1 == (xml_node_struct *)0x0) {
    pxVar1 = (this->_parent)._root;
    if ((pxVar1 == (xml_node_struct *)0x0) ||
       (pxVar1 = pxVar1->first_child, pxVar1 == (xml_node_struct *)0x0)) {
      pxVar1 = (xml_node_struct *)0x0;
    }
    else {
      pxVar1 = pxVar1->prev_sibling_c;
    }
  }
  else {
    pxVar1 = pxVar1->prev_sibling_c;
    if (pxVar1->next_sibling == (xml_node_struct *)0x0) {
      pxVar1 = (xml_node_struct *)0x0;
    }
  }
  (this->_wrap)._root = pxVar1;
  return this;
}

Assistant:

PUGI_IMPL_FN xml_node_iterator& xml_node_iterator::operator--()
	{
		_wrap = _wrap._root ? _wrap.previous_sibling() : _parent.last_child();
		return *this;
	}